

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

void lj_err_lex(lua_State *L,GCstr *src,char *tok,BCLine line,ErrMsg em,__va_list_tag *argp)

{
  char *pcVar1;
  lua_State *L_00;
  uint in_ECX;
  long in_RDX;
  lua_State *in_RDI;
  char *msg;
  char buff [60];
  __va_list_tag *in_stack_00000108;
  char *in_stack_00000110;
  lua_State *in_stack_00000118;
  int in_stack_ffffffffffffff8c;
  GCstr *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  
  lj_debug_shortname(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  pcVar1 = lj_str_pushvf(in_stack_00000118,in_stack_00000110,in_stack_00000108);
  L_00 = (lua_State *)lj_str_pushf(in_RDI,"%s:%d: %s",&stack0xffffffffffffff98,(ulong)in_ECX,pcVar1)
  ;
  if (in_RDX != 0) {
    lj_str_pushf(in_RDI,lj_err_allmsg + 0x8c4,L_00,in_RDX);
  }
  lj_err_throw(L_00,in_stack_ffffffffffffff8c);
}

Assistant:

LJ_NOINLINE void lj_err_lex(lua_State *L, GCstr *src, const char *tok,
			    BCLine line, ErrMsg em, va_list argp)
{
  char buff[LUA_IDSIZE];
  const char *msg;
  lj_debug_shortname(buff, src);
  msg = lj_str_pushvf(L, err2msg(em), argp);
  msg = lj_str_pushf(L, "%s:%d: %s", buff, line, msg);
  if (tok)
    lj_str_pushf(L, err2msg(LJ_ERR_XNEAR), msg, tok);
  lj_err_throw(L, LUA_ERRSYNTAX);
}